

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

InputDeclaration * __thiscall
soul::PoolAllocator::allocate<soul::heart::InputDeclaration,soul::CodeLocation&>
          (PoolAllocator *this,CodeLocation *args)

{
  void **this_00;
  SourceCodeText *pSVar1;
  _lambda_void___1_ local_45 [13];
  CodeLocation local_38;
  void **local_28;
  InputDeclaration *newObject;
  PoolItem *newItem;
  CodeLocation *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args;
  args_local = (CodeLocation *)this;
  newObject = (InputDeclaration *)allocateSpaceForObject(this,0x78);
  this_00 = &((PoolItem *)newObject)->item;
  CodeLocation::CodeLocation(&local_38,(CodeLocation *)newItem);
  heart::InputDeclaration::InputDeclaration((InputDeclaration *)this_00,&local_38);
  CodeLocation::~CodeLocation(&local_38);
  local_28 = this_00;
  pSVar1 = (SourceCodeText *)
           allocate(soul::CodeLocation&)::{lambda(void*)#1}::operator_cast_to_function_pointer
                     (local_45);
  (newObject->super_IODeclaration).super_Object.location.sourceCode.object = pSVar1;
  return (InputDeclaration *)local_28;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }